

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::ChatAt(VirtualMachine *this)

{
  element_type *peVar1;
  string *val;
  Variable VVar2;
  Variable VVar3;
  
  VVar2 = popOpStack(this);
  VVar3 = popOpStack(this);
  if (((VVar3.type == String) && (VVar2.type == Integer)) &&
     (VVar2.field_1 < (Object *)((VVar3.field_1.objectValue)->properties)._M_h._M_bucket_count)) {
    std::__cxx11::string::at(VVar3.field_1.integerValue);
    val = Heap::NewString_abi_cxx11_(&this->heap);
    val->_M_string_length = 0;
    *(val->_M_dataplus)._M_p = '\0';
    std::__cxx11::string::push_back((char)val);
    pushString(this,val);
  }
  else {
    pushUndefined(this);
  }
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::ChatAt() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (first.type != VariableType::String) {
    this->pushUndefined();
    this->advance();
    return;
  }

  if (second.type != VariableType::Integer) {
    this->pushUndefined();
    this->advance();
    return;
  }

  std::size_t index = static_cast<std::size_t>(second.integerValue);

  if (index >= first.stringValue->size()) {
    this->pushUndefined();
    this->advance();
    return;
  }

  char c = first.stringValue->at(index);

  auto str = this->heap.NewString();

  str->clear();
  *str += c;

  this->pushString(str);
  this->advance();
}